

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readokt.c
# Opt level: O3

int it_okt_read_sample_data(IT_SAMPLE *sample,char *data,int length)

{
  void *__dest;
  int iVar1;
  
  iVar1 = 0;
  if ((length != 0) && (iVar1 = 0, sample->length != 0)) {
    if ((length < sample->length) && (sample->length = length, length < sample->sus_loop_end)) {
      sample->sus_loop_end = length;
    }
    __dest = malloc((long)length);
    sample->data = __dest;
    if (__dest == (void *)0x0) {
      iVar1 = -1;
    }
    else {
      memcpy(__dest,data,(long)length);
    }
  }
  return iVar1;
}

Assistant:

static int it_okt_read_sample_data(IT_SAMPLE *sample, const char * data, int length)
{
	if (length && sample->length) {
		if (length < sample->length) {
			sample->length = length;
			if (length < sample->sus_loop_end) sample->sus_loop_end = length;
		}

		sample->data = malloc(length);

		if (!sample->data)
			return -1;

		memcpy(sample->data, data, length);
	}

	return 0;
}